

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hud.cpp
# Opt level: O0

void __thiscall CHud::OnRender(CHud *this)

{
  bool bVar1;
  int iVar2;
  IGraphics *pIVar3;
  CConfig *pCVar4;
  IClient *this_00;
  long in_RDI;
  byte bVar5;
  float fVar6;
  CHud *unaff_retaddr;
  undefined4 in_stack_00000008;
  float in_stack_0000000c;
  bool Race;
  CHud *in_stack_00000018;
  CHud *in_stack_00000028;
  CNetObj_Character *in_stack_00000038;
  CHud *in_stack_00000040;
  CHud *in_stack_00000048;
  CHud *in_stack_00000068;
  CHud *in_stack_00000288;
  undefined7 in_stack_fffffffffffffff0;
  
  if ((*(long *)(*(long *)(in_RDI + 8) + 0xdf8) != 0) &&
     (bVar1 = CMenus::IsActive(*(CMenus **)(*(long *)(in_RDI + 8) + 0x1b1c0)), !bVar1)) {
    bVar5 = (*(uint *)(*(long *)(in_RDI + 8) + 0x1b15c) & 8) != 0;
    CComponent::Graphics((CComponent *)0x169cda);
    fVar6 = IGraphics::ScreenAspect((IGraphics *)CONCAT17(bVar5,in_stack_fffffffffffffff0));
    *(float *)(in_RDI + 0x10) = fVar6 * 300.0;
    *(undefined4 *)(in_RDI + 0x14) = 0x43960000;
    pIVar3 = CComponent::Graphics((CComponent *)0x169d0c);
    (*(pIVar3->super_IInterface)._vptr_IInterface[5])
              (0,0,*(undefined4 *)(in_RDI + 0x10),*(undefined4 *)(in_RDI + 0x14));
    pCVar4 = CComponent::Config((CComponent *)0x169d32);
    if (pCVar4->m_ClShowhud != 0) {
      if ((*(long *)(*(long *)(in_RDI + 8) + 0xdc0) == 0) ||
         ((*(uint *)(*(long *)(*(long *)(in_RDI + 8) + 0xdf8) + 4) & 0xc) != 0)) {
        if ((*(byte *)(*(long *)(in_RDI + 8) + 0x1628) & 1) != 0) {
          if ((*(int *)(*(long *)(in_RDI + 8) + 0x1630) != -1) &&
             (RenderHealthAndAmmo(in_stack_00000040,in_stack_00000038), (bVar5 & 1) != 0)) {
            RenderRaceTime(in_stack_00000040,(CNetObj_PlayerInfoRace *)in_stack_00000038);
            RenderCheckpoint(in_stack_00000028);
          }
          RenderSpectatorHud(in_stack_00000068);
          RenderSpectatorNotification(this);
        }
      }
      else {
        RenderHealthAndAmmo(in_stack_00000040,in_stack_00000038);
        if (((bVar5 & 1) != 0) && (*(int *)(*(long *)(in_RDI + 8) + 0x1b140) != -1)) {
          RenderRaceTime(in_stack_00000040,(CNetObj_PlayerInfoRace *)in_stack_00000038);
          RenderCheckpoint(in_stack_00000028);
        }
      }
      RenderGameTimer((CHud *)in_stack_00000038);
      RenderPauseTimer((CHud *)in_stack_00000038);
      RenderStartCountdown(in_stack_00000018);
      RenderNetworkIssueNotification(unaff_retaddr);
      RenderDeadNotification(unaff_retaddr);
      RenderScoreHud(in_stack_00000288);
      RenderWarmupTimer(in_stack_00000048);
      RenderFps((CHud *)CONCAT44(in_stack_0000000c,in_stack_00000008));
      this_00 = CComponent::Client((CComponent *)0x169eb3);
      iVar2 = IClient::State(this_00);
      if (iVar2 != 4) {
        RenderConnectionWarning(unaff_retaddr);
      }
      RenderTeambalanceWarning(this);
      RenderVoting(in_stack_00000048);
      RenderLocalTime(this,in_stack_0000000c);
    }
    RenderCursor(in_stack_00000018);
  }
  return;
}

Assistant:

void CHud::OnRender()
{
	if(!m_pClient->m_Snap.m_pGameData)
		return;

	// dont render hud if the menu is active
	if(m_pClient->m_pMenus->IsActive())
		return;

	bool Race = m_pClient->m_GameInfo.m_GameFlags&GAMEFLAG_RACE;

	m_Width = 300.0f*Graphics()->ScreenAspect();
	m_Height = 300.0f;
	Graphics()->MapScreen(0.0f, 0.0f, m_Width, m_Height);

	if(Config()->m_ClShowhud)
	{
		if(m_pClient->m_Snap.m_pLocalCharacter && !(m_pClient->m_Snap.m_pGameData->m_GameStateFlags&(GAMESTATEFLAG_ROUNDOVER|GAMESTATEFLAG_GAMEOVER)))
		{
			RenderHealthAndAmmo(m_pClient->m_Snap.m_pLocalCharacter);
			if(Race && m_pClient->m_LocalClientID != -1)
			{
				RenderRaceTime(m_pClient->m_Snap.m_paPlayerInfosRace[m_pClient->m_LocalClientID]);
				RenderCheckpoint();
			}
		}
		else if(m_pClient->m_Snap.m_SpecInfo.m_Active)
		{
			if(m_pClient->m_Snap.m_SpecInfo.m_SpectatorID != -1)
			{
				RenderHealthAndAmmo(&m_pClient->m_Snap.m_aCharacters[m_pClient->m_Snap.m_SpecInfo.m_SpectatorID].m_Cur);
				if(Race)
				{
					RenderRaceTime(m_pClient->m_Snap.m_paPlayerInfosRace[m_pClient->m_Snap.m_SpecInfo.m_SpectatorID]);
					RenderCheckpoint();
				}
			}
			RenderSpectatorHud();
			RenderSpectatorNotification();
		}

		RenderGameTimer();
		RenderPauseTimer();
		RenderStartCountdown();
		RenderNetworkIssueNotification();
		RenderDeadNotification();
		RenderScoreHud();
		RenderWarmupTimer();
		RenderFps();
		if(Client()->State() != IClient::STATE_DEMOPLAYBACK)
			RenderConnectionWarning();
		RenderTeambalanceWarning();
		RenderVoting();
		RenderLocalTime((m_Width/7)*3);
	}
	RenderCursor();
}